

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

bool __thiscall QProcessPrivate::openChannelsForDetached(QProcessPrivate *this)

{
  bool bVar1;
  ProcessChannelType PVar2;
  long in_FS_OFFSET;
  QMessageLogger local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  PVar2 = (this->stdinChannel).type;
  if (PVar2 == Normal) {
LAB_003cc4d7:
    PVar2 = (this->stdoutChannel).type;
    if (PVar2 != Normal) {
      if (((PVar2 != Redirect) && (PVar2 != PipeSource)) || ((this->processChannelMode & 0xfe) == 2)
         ) {
        local_38.context.version = 2;
        local_38.context.function._4_4_ = 0;
        local_38.context._4_8_ = 0;
        local_38.context._12_8_ = 0;
        local_38.context.category = "default";
        QMessageLogger::warning
                  (&local_38,
                   "QProcess::openChannelsForDetached: Inconsistent stdout channel configuration");
      }
      if (((PVar2 | PipeSink) == Redirect) &&
         (bVar1 = openChannel(this,&this->stdoutChannel), !bVar1)) goto LAB_003cc55c;
    }
    PVar2 = (this->stderrChannel).type;
    if (PVar2 != Normal) {
      if (PVar2 == Redirect) {
        if ((this->processChannelMode < 5) &&
           ((0x16U >> (this->processChannelMode & 0x1f) & 1) != 0)) {
          local_38.context.version = 2;
          local_38.context.function._4_4_ = 0;
          local_38.context._4_8_ = 0;
          local_38.context._12_8_ = 0;
          local_38.context.category = "default";
          QMessageLogger::warning
                    (&local_38,
                     "QProcess::openChannelsForDetached: Inconsistent stderr channel configuration")
          ;
        }
        bVar1 = openChannel(this,&this->stderrChannel);
        if (!bVar1) goto LAB_003cc55c;
      }
      else {
        local_38.context.version = 2;
        local_38.context.function._4_4_ = 0;
        local_38.context._4_8_ = 0;
        local_38.context._12_8_ = 0;
        local_38.context.category = "default";
        QMessageLogger::warning
                  (&local_38,
                   "QProcess::openChannelsForDetached: Inconsistent stderr channel configuration");
      }
    }
    bVar1 = true;
  }
  else {
    PVar2 = PVar2 & ~PipeSource;
    if ((PVar2 != PipeSink) || (this->inputChannelMode == '\x01')) {
      local_38.context.version = 2;
      local_38.context.function._4_4_ = 0;
      local_38.context._4_8_ = 0;
      local_38.context._12_8_ = 0;
      local_38.context.category = "default";
      QMessageLogger::warning
                (&local_38,
                 "QProcess::openChannelsForDetached: Inconsistent stdin channel configuration");
      if (PVar2 != PipeSink) goto LAB_003cc4d7;
    }
    bVar1 = openChannel(this,&this->stdinChannel);
    if (bVar1) goto LAB_003cc4d7;
LAB_003cc55c:
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessPrivate::openChannelsForDetached()
{
    // stdin channel.
    bool needToOpen = (stdinChannel.type == Channel::Redirect
                       || stdinChannel.type == Channel::PipeSink);
    if (stdinChannel.type != Channel::Normal
            && (!needToOpen
                || inputChannelMode == QProcess::ForwardedInputChannel)) {
        qWarning("QProcess::openChannelsForDetached: Inconsistent stdin channel configuration");
    }
    if (needToOpen && !openChannel(stdinChannel))
        return false;

    // stdout channel.
    needToOpen = (stdoutChannel.type == Channel::Redirect
                  || stdoutChannel.type == Channel::PipeSource);
    if (stdoutChannel.type != Channel::Normal
            && (!needToOpen
                || processChannelMode == QProcess::ForwardedChannels
                || processChannelMode == QProcess::ForwardedOutputChannel)) {
        qWarning("QProcess::openChannelsForDetached: Inconsistent stdout channel configuration");
    }
    if (needToOpen && !openChannel(stdoutChannel))
        return false;

    // stderr channel.
    needToOpen = (stderrChannel.type == Channel::Redirect);
    if (stderrChannel.type != Channel::Normal
            && (!needToOpen
                || processChannelMode == QProcess::ForwardedChannels
                || processChannelMode == QProcess::ForwardedErrorChannel
                || processChannelMode == QProcess::MergedChannels)) {
        qWarning("QProcess::openChannelsForDetached: Inconsistent stderr channel configuration");
    }
    if (needToOpen && !openChannel(stderrChannel))
        return false;

    return true;
}